

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalVerifyVector,duckdb::PhysicalOperator&,duckdb::DebugVectorVerification&>
          (PhysicalPlan *this,PhysicalOperator *args,DebugVectorVerification *args_1)

{
  PhysicalVerifyVector *this_00;
  reference_wrapper<duckdb::PhysicalOperator> local_28;
  
  this_00 = (PhysicalVerifyVector *)ArenaAllocator::AllocateAligned(&this->arena,0x88);
  PhysicalVerifyVector::PhysicalVerifyVector(this_00,args,*args_1);
  local_28._M_data = (PhysicalOperator *)this_00;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&this->ops,&local_28);
  return &this_00->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}